

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

int Abc_SclCountMaxPhases(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  void *__s;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  pVVar3 = pNtk->vObjs;
  iVar1 = pVVar3->nSize;
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  if (iVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar7 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  if (pVVar3->nSize < 1) {
    iVar7 = 0;
  }
  else {
    ppvVar4 = pVVar3->pArray;
    lVar8 = 0;
    iVar7 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar8];
      if (((plVar5 != (long *)0x0) && (uVar9 = *(uint *)((long)plVar5 + 0x14) & 0xf, uVar9 < 8)) &&
         ((0x98U >> uVar9 & 1) != 0)) {
        if ((long)*(int *)((long)plVar5 + 0x1c) < 1) {
          iVar10 = 0;
        }
        else {
          lVar11 = 0;
          iVar10 = 0;
          do {
            iVar12 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                       (long)*(int *)(plVar5[4] + lVar11 * 4) * 8) + 0x10);
            if (((long)iVar12 < 0) || (iVar1 <= iVar12)) {
LAB_00451ca2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar6 = *(long *)(*plVar5 + 0x180);
            if (lVar6 == 0) {
              __assert_fail("p->pNtk->vPhases",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x18a,"int Abc_ObjFaninPhase(Abc_Obj_t *, int)");
            }
            iVar2 = (int)plVar5[2];
            if (((long)iVar2 < 0) || (*(int *)(lVar6 + 4) <= iVar2)) goto LAB_00451ca2;
            iVar12 = *(int *)((long)__s + (long)iVar12 * 4) +
                     (uint)((*(uint *)(*(long *)(lVar6 + 8) + (long)iVar2 * 4) >>
                             ((uint)lVar11 & 0x1f) & 1) != 0);
            if (iVar10 <= iVar12) {
              iVar10 = iVar12;
            }
            lVar11 = lVar11 + 1;
          } while (*(int *)((long)plVar5 + 0x1c) != lVar11);
        }
        if (iVar1 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)__s + lVar8 * 4) = iVar10;
        if (iVar7 <= iVar10) {
          iVar7 = iVar10;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar3->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar7;
}

Assistant:

int Abc_SclCountMaxPhases( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vPhLevel;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Max = 0, MaxAll = 0;
    vPhLevel = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        Max = 0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Max = Abc_MaxInt( Max, Vec_IntEntry(vPhLevel, Abc_ObjId(pFanin)) + Abc_ObjFaninPhase(pObj, k) );
        Vec_IntWriteEntry( vPhLevel, i, Max );
        MaxAll = Abc_MaxInt( MaxAll, Max );
    }
    Vec_IntFree( vPhLevel );
    return MaxAll;
}